

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::utp_socket_impl::write_sack(utp_socket_impl *this,uint8_t *buf,int size)

{
  packet *ppVar1;
  index_type idx;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  
  if (size != 0) {
    pbVar4 = buf + size;
    idx = *(int *)&this->m_ack_nr + 2U & 0xffff;
    do {
      *buf = 0;
      bVar2 = 1;
      iVar3 = 8;
      do {
        ppVar1 = packet_buffer::at(&this->m_inbuf,idx);
        if (ppVar1 != (packet *)0x0) {
          *buf = *buf | bVar2;
        }
        bVar2 = bVar2 * '\x02';
        idx = idx + 1 & 0xffff;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      buf = buf + 1;
    } while (buf != pbVar4);
  }
  return;
}

Assistant:

void utp_socket_impl::write_sack(std::uint8_t* buf, int const size) const
{
	INVARIANT_CHECK;

	TORRENT_ASSERT(m_inbuf.size());
	int ack_nr = (m_ack_nr + 2) & ACK_MASK;
	std::uint8_t* end = buf + size;

	for (; buf != end; ++buf)
	{
		*buf = 0;
		int mask = 1;
		for (int i = 0; i < 8; ++i)
		{
			if (m_inbuf.at(aux::numeric_cast<packet_buffer::index_type>(ack_nr))) *buf |= mask;
			mask <<= 1;
			ack_nr = (ack_nr + 1) & ACK_MASK;
		}
	}
}